

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O1

void __thiscall
chrono::ChContactContainerSMC::InjectKRMmatrices
          (ChContactContainerSMC *this,ChSystemDescriptor *mdescriptor)

{
  _List_node_base *p_Var1;
  _List_node_base local_110;
  _List_node_base local_f8;
  _List_node_base local_e0;
  _List_node_base local_c8;
  _List_node_base local_b0;
  _List_node_base local_98;
  _List_node_base local_80;
  _List_node_base local_68;
  _List_node_base local_50;
  _List_node_base local_38;
  
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
          *)&local_38,&this->contactlist_3_3);
  for (p_Var1 = local_38._M_next; p_Var1 != &local_38;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_38._M_next != &local_38) {
    p_Var1 = (local_38._M_next)->_M_next;
    operator_delete(local_38._M_next,0x18);
    local_38._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
          *)&local_50,&this->contactlist_6_3);
  for (p_Var1 = local_50._M_next; p_Var1 != &local_50;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_50._M_next != &local_50) {
    p_Var1 = (local_50._M_next)->_M_next;
    operator_delete(local_50._M_next,0x18);
    local_50._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
          *)&local_68,&this->contactlist_6_6);
  for (p_Var1 = local_68._M_next; p_Var1 != &local_68;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_68._M_next != &local_68) {
    p_Var1 = (local_68._M_next)->_M_next;
    operator_delete(local_68._M_next,0x18);
    local_68._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
          *)&local_80,&this->contactlist_333_3);
  for (p_Var1 = local_80._M_next; p_Var1 != &local_80;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_80._M_next != &local_80) {
    p_Var1 = (local_80._M_next)->_M_next;
    operator_delete(local_80._M_next,0x18);
    local_80._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
          *)&local_98,&this->contactlist_333_6);
  for (p_Var1 = local_98._M_next; p_Var1 != &local_98;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_98._M_next != &local_98) {
    p_Var1 = (local_98._M_next)->_M_next;
    operator_delete(local_98._M_next,0x18);
    local_98._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
          *)&local_b0,&this->contactlist_333_333);
  for (p_Var1 = local_b0._M_next; p_Var1 != &local_b0;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_b0._M_next != &local_b0) {
    p_Var1 = (local_b0._M_next)->_M_next;
    operator_delete(local_b0._M_next,0x18);
    local_b0._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
          *)&local_c8,&this->contactlist_666_3);
  for (p_Var1 = local_c8._M_next; p_Var1 != &local_c8;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_c8._M_next != &local_c8) {
    p_Var1 = (local_c8._M_next)->_M_next;
    operator_delete(local_c8._M_next,0x18);
    local_c8._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
          *)&local_e0,&this->contactlist_666_6);
  for (p_Var1 = local_e0._M_next; p_Var1 != &local_e0;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_e0._M_next != &local_e0) {
    p_Var1 = (local_e0._M_next)->_M_next;
    operator_delete(local_e0._M_next,0x18);
    local_e0._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
          *)&local_f8,&this->contactlist_666_333);
  for (p_Var1 = local_f8._M_next; p_Var1 != &local_f8;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_f8._M_next != &local_f8) {
    p_Var1 = (local_f8._M_next)->_M_next;
    operator_delete(local_f8._M_next,0x18);
    local_f8._M_next = p_Var1;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
  ::list((list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
          *)&local_110,&this->contactlist_666_666);
  for (p_Var1 = local_110._M_next; p_Var1 != &local_110;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)(p_Var1[1]._M_next,mdescriptor);
  }
  while (local_110._M_next != &local_110) {
    p_Var1 = (local_110._M_next)->_M_next;
    operator_delete(local_110._M_next,0x18);
    local_110._M_next = p_Var1;
  }
  return;
}

Assistant:

void ChContactContainerSMC::InjectKRMmatrices(ChSystemDescriptor& mdescriptor) {
    _InjectKRMmatrices(contactlist_3_3, mdescriptor);
    _InjectKRMmatrices(contactlist_6_3, mdescriptor);
    _InjectKRMmatrices(contactlist_6_6, mdescriptor);
    _InjectKRMmatrices(contactlist_333_3, mdescriptor);
    _InjectKRMmatrices(contactlist_333_6, mdescriptor);
    _InjectKRMmatrices(contactlist_333_333, mdescriptor);
    _InjectKRMmatrices(contactlist_666_3, mdescriptor);
    _InjectKRMmatrices(contactlist_666_6, mdescriptor);
    _InjectKRMmatrices(contactlist_666_333, mdescriptor);
    _InjectKRMmatrices(contactlist_666_666, mdescriptor);
}